

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

uint32_t __thiscall spvtools::opt::IRContext::GetBuiltinInputVarId(IRContext *this,uint32_t builtin)

{
  pointer pOVar1;
  byte *pbVar2;
  ulong uVar3;
  TypeManager *this_00;
  undefined1 *puVar4;
  Instruction *this_01;
  uint32_t uVar5;
  _Hash_node_base *p_Var6;
  Type *pTVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  Float float_ty;
  Vector v3float_ty;
  uint32_t local_c0;
  uint32_t local_bc;
  undefined1 local_b8 [24];
  pointer local_a0;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_98;
  undefined1 local_90;
  undefined1 local_88 [32];
  undefined1 *local_68;
  Type *local_60 [2];
  Instruction *local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  local_c0 = builtin;
  if ((this->valid_analyses_ & kAnalysisBuiltinVarId) == kAnalysisNone) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->builtin_var_id_map_)._M_h);
    pbVar2 = (byte *)((long)&this->valid_analyses_ + 1);
    *pbVar2 = *pbVar2 | 0x10;
  }
  uVar3 = (this->builtin_var_id_map_)._M_h._M_bucket_count;
  uVar9 = (ulong)local_c0 % uVar3;
  p_Var10 = (this->builtin_var_id_map_)._M_h._M_buckets[uVar9];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var10->_M_nxt, p_Var11 = p_Var10, local_c0 != *(uint *)&p_Var10->_M_nxt[1]._M_nxt))
  {
    while (p_Var10 = p_Var6, p_Var6 = p_Var10->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar3 != uVar9) ||
         (p_Var11 = p_Var10, local_c0 == *(uint *)&p_Var6[1]._M_nxt)) goto LAB_0023b773;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_0023b773:
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var11->_M_nxt;
  }
  if (p_Var6 != (_Hash_node_base *)0x0) {
    return *(uint32_t *)((long)&p_Var6[1]._M_nxt + 4);
  }
  uVar5 = FindBuiltinInputVar(this,local_c0);
  if (uVar5 != 0) goto LAB_0023bc62;
  if ((this->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    BuildTypeManager(this);
  }
  this_00 = (this->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((int)local_c0 < 0x29) {
    if ((int)local_c0 < 0xf) {
      if (local_c0 - 7 < 2) goto LAB_0023b822;
      if (local_c0 != 0xd) {
LAB_0023b892:
        __assert_fail("false && \"unhandled builtin\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp"
                      ,0x388,"uint32_t spvtools::opt::IRContext::GetBuiltinInputVarId(uint32_t)");
      }
      local_98._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x2000000003;
      local_b8._0_8_ = &PTR__Type_003ed9a0;
LAB_0023b8fd:
      local_a0 = (pointer)0x0;
      local_b8._16_4_ = (array<signed_char,_4UL>)0x0;
      local_b8._20_4_ = (array<signed_char,_4UL>)0x0;
      local_b8._8_8_ = (pointer)0x0;
      pTVar7 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_b8);
      uVar5 = 3;
    }
    else {
      if (local_c0 != 0xf) {
        if (local_c0 != 0x1c) goto LAB_0023b892;
        goto LAB_0023b8bb;
      }
      local_98._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x2000000003;
      local_b8._0_8_ = &PTR__Type_003ed9a0;
LAB_0023b99f:
      local_a0 = (pointer)0x0;
      local_b8._16_4_ = (array<signed_char,_4UL>)0x0;
      local_b8._20_4_ = (array<signed_char,_4UL>)0x0;
      local_b8._8_8_ = (pointer)0x0;
      pTVar7 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_b8);
      uVar5 = 4;
    }
    puVar4 = local_b8;
    analysis::Vector::Vector((Vector *)local_88,pTVar7,uVar5);
    pTVar7 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_88);
    local_88._0_8_ = &PTR__Type_003e9e18;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)(local_88 + 8));
    local_b8._0_8_ = &PTR__Type_003e9e18;
  }
  else {
    if (2 < local_c0 - 0x29) {
      if (local_c0 == 0x1144) {
        local_98._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x2000000002;
        local_b8._0_8_ = &PTR__Type_003ed780;
        local_90 = 0;
        goto LAB_0023b99f;
      }
      if (local_c0 != 0x14c7) goto LAB_0023b892;
LAB_0023b8bb:
      local_98._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x2000000002;
      local_b8._0_8_ = &PTR__Type_003ed780;
      local_90 = 0;
      goto LAB_0023b8fd;
    }
LAB_0023b822:
    puVar4 = local_88;
    local_88._8_8_ = (pointer)0x0;
    local_88._16_8_ = (pointer)0x0;
    local_88._24_8_ = (pointer)0x0;
    local_68 = (undefined1 *)0x2000000002;
    local_88._0_8_ = &PTR__Type_003ed780;
    local_60[0] = (Type *)((ulong)local_60[0] & 0xffffffffffffff00);
    pTVar7 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_88);
    local_88._0_8_ = &PTR__Type_003e9e18;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)(puVar4 + 8));
  uVar5 = analysis::TypeManager::GetTypeInstruction(this_00,pTVar7);
  local_bc = analysis::TypeManager::FindPointerToType(this_00,uVar5,Input);
  uVar5 = Module::TakeNextIdBound
                    ((this->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((uVar5 == 0) && ((this->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_b8._0_8_ = (pointer)0x25;
    local_88._0_8_ = local_88 + 0x10;
    local_88._0_8_ = std::__cxx11::string::_M_create((ulong *)local_88,(ulong)local_b8);
    local_88._16_8_ = local_b8._0_8_;
    *(undefined8 *)local_88._0_8_ = 0x667265766f204449;
    *(undefined8 *)(local_88._0_8_ + 8) = 0x797254202e776f6c;
    *(undefined8 *)(local_88._0_8_ + 0x10) = 0x676e696e6e757220;
    *(undefined8 *)(local_88._0_8_ + 0x18) = 0x746361706d6f6320;
    builtin_strncpy((char *)(local_88._0_8_ + 0x1d),"act-ids.",8);
    local_88._8_8_ = local_b8._0_8_;
    *(char *)(local_88._0_8_ + local_b8._0_8_) = '\0';
    local_b8._0_8_ = (_func_int **)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_b8._16_4_ = (array<signed_char,_4UL>)0x0;
    local_b8._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&this->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_b8,(char *)local_88._0_8_);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,
                      (ulong)((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      local_88._16_8_)->_M_impl).super__Vector_impl_data._M_start +
                             1));
    }
  }
  local_50 = (Instruction *)operator_new(0x70);
  local_a0 = (pointer)(local_b8 + 0x10);
  local_b8._0_8_ = &PTR__SmallVector_003e9b28;
  local_98._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_b8._16_4_ = (array<signed_char,_4UL>)0x1;
  local_b8._8_8_ = (pointer)0x1;
  local_88._0_4_ = 6;
  local_88._8_8_ = &PTR__SmallVector_003e9b28;
  local_88._16_8_ = (pointer)0x0;
  local_68 = local_88 + 0x18;
  local_60[0] = (Type *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_88 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  this_01 = local_50;
  pOVar1 = local_48.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
  (local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
   _M_impl.super__Vector_impl_data._M_start)->type = local_88._0_4_;
  ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start)->words)._vptr_SmallVector =
       (_func_int **)&PTR__SmallVector_003e9b28;
  ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start)->words).size_ = 0;
  ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start)->words).small_data_ =
       (uint *)((local_48.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start)->words).buffer;
  ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start)->words).large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (&(local_48.
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start)->words,
             (SmallVector<unsigned_int,_2UL> *)(local_88 + 8));
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = pOVar1;
  Instruction::Instruction(this_01,this,OpVariable,local_bc,uVar5,&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  local_88._8_8_ = &PTR__SmallVector_003e9b28;
  if (local_60[0] != (Type *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)local_60
               ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60[0]);
  }
  local_60[0] = (Type *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_003e9b28;
  if (local_98._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_98._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    BuildDefUseManager(this);
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((this->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             this_01);
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((this->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_)
              .super_IntrusiveList<spvtools::opt::Instruction>,this_01);
  if ((this->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    BuildDecorationManager(this);
  }
  analysis::DecorationManager::AddDecorationVal
            ((this->decoration_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
             _M_head_impl,uVar5,0xb,local_c0);
  AddVarToEntryPoints(this,uVar5);
LAB_0023bc62:
  pmVar8 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->builtin_var_id_map_,&local_c0);
  *pmVar8 = uVar5;
  return uVar5;
}

Assistant:

uint32_t IRContext::GetBuiltinInputVarId(uint32_t builtin) {
  if (!AreAnalysesValid(kAnalysisBuiltinVarId)) ResetBuiltinAnalysis();
  // If cached, return it.
  std::unordered_map<uint32_t, uint32_t>::iterator it =
      builtin_var_id_map_.find(builtin);
  if (it != builtin_var_id_map_.end()) return it->second;
  // Look for one in shader
  uint32_t var_id = FindBuiltinInputVar(builtin);
  if (var_id == 0) {
    // If not found, create it
    // TODO(greg-lunarg): Add support for all builtins
    analysis::TypeManager* type_mgr = get_type_mgr();
    analysis::Type* reg_type;
    switch (spv::BuiltIn(builtin)) {
      case spv::BuiltIn::FragCoord: {
        analysis::Float float_ty(32);
        analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
        analysis::Vector v4float_ty(reg_float_ty, 4);
        reg_type = type_mgr->GetRegisteredType(&v4float_ty);
        break;
      }
      case spv::BuiltIn::VertexIndex:
      case spv::BuiltIn::InstanceIndex:
      case spv::BuiltIn::PrimitiveId:
      case spv::BuiltIn::InvocationId:
      case spv::BuiltIn::SubgroupLocalInvocationId: {
        analysis::Integer uint_ty(32, false);
        reg_type = type_mgr->GetRegisteredType(&uint_ty);
        break;
      }
      case spv::BuiltIn::GlobalInvocationId:
      case spv::BuiltIn::LaunchIdNV: {
        analysis::Integer uint_ty(32, false);
        analysis::Type* reg_uint_ty = type_mgr->GetRegisteredType(&uint_ty);
        analysis::Vector v3uint_ty(reg_uint_ty, 3);
        reg_type = type_mgr->GetRegisteredType(&v3uint_ty);
        break;
      }
      case spv::BuiltIn::TessCoord: {
        analysis::Float float_ty(32);
        analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
        analysis::Vector v3float_ty(reg_float_ty, 3);
        reg_type = type_mgr->GetRegisteredType(&v3float_ty);
        break;
      }
      case spv::BuiltIn::SubgroupLtMask: {
        analysis::Integer uint_ty(32, false);
        analysis::Type* reg_uint_ty = type_mgr->GetRegisteredType(&uint_ty);
        analysis::Vector v4uint_ty(reg_uint_ty, 4);
        reg_type = type_mgr->GetRegisteredType(&v4uint_ty);
        break;
      }
      default: {
        assert(false && "unhandled builtin");
        return 0;
      }
    }
    uint32_t type_id = type_mgr->GetTypeInstruction(reg_type);
    uint32_t varTyPtrId =
        type_mgr->FindPointerToType(type_id, spv::StorageClass::Input);
    // TODO(1841): Handle id overflow.
    var_id = TakeNextId();
    std::unique_ptr<Instruction> newVarOp(
        new Instruction(this, spv::Op::OpVariable, varTyPtrId, var_id,
                        {{spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
                          {uint32_t(spv::StorageClass::Input)}}}));
    get_def_use_mgr()->AnalyzeInstDefUse(&*newVarOp);
    module()->AddGlobalValue(std::move(newVarOp));
    get_decoration_mgr()->AddDecorationVal(
        var_id, uint32_t(spv::Decoration::BuiltIn), builtin);
    AddVarToEntryPoints(var_id);
  }
  builtin_var_id_map_[builtin] = var_id;
  return var_id;
}